

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

bool __thiscall
SymbolTable::addEquation
          (SymbolTable *this,Identifier *name,int file,int section,size_t referenceIndex)

{
  char *pcVar1;
  bool bVar2;
  int file_00;
  mapped_type *pmVar3;
  int section_00;
  SymbolKey key;
  SymbolKey local_50;
  
  bVar2 = isValidSymbolName(name);
  if ((!bVar2) || (bVar2 = symbolExists(this,name,file,section), bVar2)) {
    bVar2 = false;
  }
  else {
    pcVar1 = (name->_name)._M_dataplus._M_p;
    section_00 = -1;
    file_00 = -1;
    if ((*pcVar1 == '@') && (file_00 = -1, section_00 = section, pcVar1[1] != '@')) {
      section_00 = file_00;
      file_00 = file;
    }
    SymbolKey::SymbolKey(&local_50,name,file_00,section_00);
    pmVar3 = std::
             map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
             ::operator[](&this->symbols,&local_50);
    pmVar3->type = EquationSymbol;
    pmVar3->index = referenceIndex;
    this->equationsCount = this->equationsCount + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
      operator_delete(local_50.name._M_dataplus._M_p,local_50.name.field_2._M_allocated_capacity + 1
                     );
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SymbolTable::addEquation(const Identifier& name, int file, int section, size_t referenceIndex)
{
	if (!isValidSymbolName(name))
		return false;

	if (symbolExists(name,file,section))
		return false;
	
	setFileSectionValues(name,file,section);

	SymbolKey key = { name, file, section };
	SymbolInfo value = { EquationSymbol, referenceIndex };
	symbols[key] = value;

	equationsCount++;
	return true;
}